

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalCopyToFile::Sink
          (PhysicalCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  CopyToFunctionGlobalState *this_00;
  CopyToFunctionLocalState *this_01;
  ClientContext *pCVar1;
  GlobalSinkState *global_state;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> _Var2;
  copy_to_sink_t p_Var3;
  char cVar4;
  type pGVar5;
  type pFVar6;
  type pGVar7;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> _Var8;
  type pLVar9;
  ClientContext *pCVar10;
  undefined1 local_80 [16];
  pointer local_70;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> global_lock;
  
  this_00 = (CopyToFunctionGlobalState *)input->global_state;
  this_01 = (CopyToFunctionLocalState *)input->local_state;
  if (this->write_empty_file == false) {
    CopyToFunctionGlobalState::Initialize(this_00,context->client,this);
  }
  this_01->total_rows_copied = this_01->total_rows_copied + chunk->count;
  if (this->partition_output == true) {
    CopyToFunctionLocalState::AppendToPartition(this_01,context,this,this_00,chunk);
    return NEED_MORE_INPUT;
  }
  if (this->per_thread_output != true) {
    if (((this->file_size_bytes).index == 0xffffffffffffffff) && (this->rotate == false)) {
      local_80._8_8_ = (this->function).copy_to_sink;
      pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(&this->bind_data);
      pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*(&this_00->global_state);
      pLVar9 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
               ::operator*(&this_01->local_state);
      (*(code *)local_80._8_8_)(context,pFVar6,pGVar5,pLVar9,chunk);
      return NEED_MORE_INPUT;
    }
    global_state = input->global_state;
    global_lock.
    super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
          )0x0;
    global_lock.
    super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
    super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
    super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         operator_new(0x20);
    *(PhysicalCopyToFile **)
     global_lock.
     super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
     super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
     _M_t.
     super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
     super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl = this;
    *(ExecutionContext **)
     ((long)global_lock.
            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl + 8) = context;
    *(CopyToFunctionLocalState **)
     ((long)global_lock.
            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl + 0x10) = this_01;
    *(DataChunk **)
     ((long)global_lock.
            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl + 0x18) = chunk;
    WriteRotateInternal(this,context,global_state,
                        (function<void_(duckdb::GlobalFunctionData_&)> *)&global_lock);
    ::std::_Function_base::~_Function_base((_Function_base *)&global_lock);
    return NEED_MORE_INPUT;
  }
  pCVar10 = (ClientContext *)&this_01->global_state;
  if ((this_01->global_state).
      super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
      .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl ==
      (GlobalFunctionData *)0x0) {
    StorageLock::GetExclusiveLock((StorageLock *)&global_lock);
    local_80._8_8_ = context->client;
    pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(this->super_PhysicalOperator).sink_state);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              (&global_lock);
    CreateFileState((PhysicalCopyToFile *)local_80,(ClientContext *)this,
                    (GlobalSinkState *)local_80._8_8_,(StorageLockKey *)pGVar7);
    _Var8._M_head_impl = (GlobalFunctionData *)local_80._0_8_;
  }
  else {
    if (this->rotate != true) goto LAB_009d6077;
    local_70 = (pointer)(this->function).rotate_next_file;
    pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)pCVar10);
    local_80._8_8_ = pCVar10;
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(&this->bind_data);
    pCVar10 = (ClientContext *)local_80._8_8_;
    cVar4 = (*(code *)local_70)(pGVar5,pFVar6,&this->file_size_bytes);
    if (cVar4 == '\0') goto LAB_009d6077;
    local_70 = (pointer)(this->function).copy_to_finalize;
    pCVar1 = context->client;
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*(&this->bind_data);
    pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)pCVar10);
    (*(code *)local_70)(pCVar1,pFVar6,pGVar5);
    StorageLock::GetExclusiveLock((StorageLock *)&global_lock);
    pCVar10 = context->client;
    pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(this->super_PhysicalOperator).sink_state);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              (&global_lock);
    CreateFileState((PhysicalCopyToFile *)local_80,(ClientContext *)this,(GlobalSinkState *)pCVar10,
                    (StorageLockKey *)pGVar7);
    _Var8._M_head_impl = (GlobalFunctionData *)local_80._0_8_;
    pCVar10 = (ClientContext *)local_80._8_8_;
  }
  local_80._0_8_ = (GlobalFunctionData *)0x0;
  _Var2._M_head_impl =
       (((_Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
          *)&(pCVar10->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>)._M_head_impl;
  (((_Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
     *)&(pCVar10->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>)._M_head_impl = _Var8._M_head_impl;
  if ((_Var2._M_head_impl != (GlobalFunctionData *)0x0) &&
     ((*(_Var2._M_head_impl)->_vptr_GlobalFunctionData[1])(),
     (GlobalFunctionData *)local_80._0_8_ != (GlobalFunctionData *)0x0)) {
    (*(*(_func_int ***)local_80._0_8_)[1])();
  }
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&global_lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
LAB_009d6077:
  p_Var3 = (this->function).copy_to_sink;
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator*(&this->bind_data);
  pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
           ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                        *)pCVar10);
  pLVar9 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
           ::operator*(&this_01->local_state);
  (*p_Var3)(context,pFVar6,pGVar5,pLVar9,chunk);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCopyToFile::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g = input.global_state.Cast<CopyToFunctionGlobalState>();
	auto &l = input.local_state.Cast<CopyToFunctionLocalState>();

	if (!write_empty_file) {
		// if we are only writing the file when there are rows to write we need to initialize here
		g.Initialize(context.client, *this);
	}
	l.total_rows_copied += chunk.size();

	if (partition_output) {
		l.AppendToPartition(context, *this, g, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	if (per_thread_output) {
		auto &gstate = l.global_state;
		if (!gstate) {
			// Lazily create file state here to prevent creating empty files
			auto global_lock = g.lock.GetExclusiveLock();
			gstate = CreateFileState(context.client, *sink_state, *global_lock);
		} else if (rotate && function.rotate_next_file(*gstate, *bind_data, file_size_bytes)) {
			function.copy_to_finalize(context.client, *bind_data, *gstate);
			auto global_lock = g.lock.GetExclusiveLock();
			gstate = CreateFileState(context.client, *sink_state, *global_lock);
		}
		function.copy_to_sink(context, *bind_data, *gstate, *l.local_state, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	if (!file_size_bytes.IsValid() && !rotate) {
		function.copy_to_sink(context, *bind_data, *g.global_state, *l.local_state, chunk);
		return SinkResultType::NEED_MORE_INPUT;
	}

	WriteRotateInternal(context, input.global_state, [&](GlobalFunctionData &gstate) {
		function.copy_to_sink(context, *bind_data, gstate, *l.local_state, chunk);
	});

	return SinkResultType::NEED_MORE_INPUT;
}